

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::imageAtomicExtensionShaderRequires_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,RenderContext *renderContext)

{
  bool bVar1;
  allocator<char> local_75 [20];
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  deUint32 local_20;
  ContextType local_1c;
  Functional *local_18;
  RenderContext *renderContext_local;
  
  local_18 = this;
  renderContext_local = (RenderContext *)__return_storage_ptr__;
  local_1c.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this + 0x10))();
  local_20 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_1c,(ApiType)local_20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_75)
    ;
    std::allocator<char>::~allocator(local_75);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"GL_OES_shader_image_atomic",&local_61);
    std::operator+(&local_40,"#extension ",&local_60);
    std::operator+(__return_storage_ptr__,&local_40," : require\n");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline string imageAtomicExtensionShaderRequires (const RenderContext& renderContext)
{
	if (!glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2)))
		return "#extension " + string(s_imageAtomicExtString) + " : require\n";
	else
		return "";
}